

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,float kappa,float delta,float theta)

{
  float fVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  undefined8 uVar2;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  _Var3;
  bool bVar4;
  undefined8 extraout_RAX;
  long lVar5;
  _Head_base<0UL,_int_*,_false> _Var6;
  uint uVar7;
  type it;
  rc_data *ret;
  rc_data *__first;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  rc_data *__last;
  long lVar14;
  bool bVar15;
  float fVar16;
  double dVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 in_register_00001304 [12];
  undefined1 local_88 [16];
  _Head_base<0UL,_int_*,_false> local_78;
  float local_6c;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_68;
  unique_ptr<int[],_std::default_delete<int[]>_> local_60;
  _Head_base<0UL,_int_*,_false> local_58;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_50;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_48;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_40;
  long local_38;
  
  if (first._M_current != last._M_current) {
    local_50._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 8);
    fVar16 = kappa / (1.0 - kappa);
    local_6c = theta;
    local_48._M_head_impl = (row_value *)last._M_current;
    do {
      if (*(int *)(this + 0x80) <= (first._M_current)->first) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ();
LAB_00145b9b:
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      iVar10 = (int)local_50._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl;
      local_68._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
           (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
            )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
              )(long)(first._M_current)->first;
      local_40._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
           (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
            )first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_88,iVar10);
      if (local_88._8_8_ != local_88._0_8_) {
        lVar14 = *(long *)(this + 0x68);
        _Var6._M_head_impl = (int *)local_88._8_8_;
        do {
          *(float *)(lVar14 + (long)*_Var6._M_head_impl * 4) =
               local_6c * *(float *)(lVar14 + (long)*_Var6._M_head_impl * 4);
          _Var6._M_head_impl = _Var6._M_head_impl + 8;
        } while (_Var6._M_head_impl != (int *)local_88._0_8_);
      }
      if (local_88._8_8_ == local_88._0_8_) {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        _Var6._M_head_impl = (int *)local_88._8_8_;
        do {
          sparse_matrix<int>::column((sparse_matrix<int> *)&local_60,iVar10);
          if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_58._M_head_impl ==
              (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
              local_60._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl) {
            auVar18 = ZEXT864(0);
          }
          else {
            auVar18 = ZEXT864(0);
            do {
              auVar19._0_4_ =
                   (float)*(int *)(*(long *)(this + 0x48) + (long)*local_58._M_head_impl * 4);
              auVar19._4_12_ = in_register_00001304;
              auVar19 = vfmadd231ss_fma(auVar18._0_16_,auVar19,
                                        ZEXT416(*(uint *)(*(long *)(this + 0x68) +
                                                         (long)*local_58._M_head_impl * 4)));
              auVar18 = ZEXT1664(auVar19);
              local_58._M_head_impl = local_58._M_head_impl + 2;
            } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                     local_58._M_head_impl !=
                     (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                     local_60._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl);
          }
          lVar14 = *(long *)(this + 0x50);
          *(int *)(lVar14 + 4 + uVar13 * 0xc) = (int)uVar13;
          *(undefined4 *)(lVar14 + 8 + uVar13 * 0xc) =
               *(undefined4 *)(*(long *)(this + 0x48) + (long)*_Var6._M_head_impl * 4);
          *(float *)(lVar14 + uVar13 * 0xc) =
               *(float *)(*(long *)(*(long *)(this + 0x70) + 8) +
                         (long)*(int *)(local_88._8_8_ + 4) * 4) - auVar18._0_4_;
          _Var6._M_head_impl = _Var6._M_head_impl + 2;
          uVar13 = uVar13 + 1;
        } while (_Var6._M_head_impl != (int *)local_88._0_8_);
      }
      uVar12 = (uint)uVar13;
      uVar13 = uVar13 & 0xffffffff;
      if (1 < uVar12) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)this;
        __first = *(rc_data **)(this + 0x50);
        std::
        __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + uVar13,(int)LZCOUNT(uVar13) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + uVar13);
        __last = __first + 1;
        lVar14 = uVar13 * 0xc + -0xc;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar14 = lVar14 + -0xc;
        } while (lVar14 != 0);
        std::
        shuffle<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
      }
      _Var3._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
           local_68._M_t.
           super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
           .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl;
      if (*(int *)(*(long *)(this + 0x58) +
                  (long)local_68._M_t.
                        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                        _M_head_impl * 0xc) < 1) {
        iVar10 = 0;
        uVar13 = 0xffffffff;
      }
      else {
        local_38 = (long)(int)uVar12 + -2;
        lVar14 = 0;
        iVar10 = 0;
        uVar11 = 0xffffffffffffffff;
        do {
          uVar2 = local_88._8_8_;
          uVar13 = uVar11 + 1;
          iVar10 = iVar10 + *(int *)(*(long *)(this + 0x50) + 8 + lVar14);
          local_78._M_head_impl._0_4_ =
               *(undefined4 *)
                (*(long *)(this + 0x58) +
                (long)_Var3._M_t.
                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                      _M_head_impl * 0xc);
          lVar8 = (long)*(int *)(*(long *)(this + 0x50) + 4 + lVar14);
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_88._8_8_ + (lVar8 * 2 + 1) * 4));
          auVar19 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + lVar14) * 0.5
                                                  )),ZEXT416((uint)fVar16),ZEXT416((uint)delta));
          *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar2 + lVar8 * 2 * 4) * 4) =
               auVar19._0_4_ +
               *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar2 + lVar8 * 2 * 4) * 4);
          if ((int)local_78._M_head_impl <= iVar10) break;
          lVar14 = lVar14 + 0xc;
          bVar4 = (long)uVar11 < local_38;
          uVar11 = uVar13;
        } while (bVar4);
      }
      uVar7 = (uint)uVar13;
      if (iVar10 < *(int *)(*(long *)(this + 0x58) +
                           (long)_Var3._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                 ._M_head_impl * 0xc)) {
        bVar4 = false;
      }
      else {
        bVar4 = iVar10 <= *(int *)(*(long *)(this + 0x58) +
                                   (long)_Var3._M_t.
                                         super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                         .
                                         super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                         ._M_head_impl * 0xc + 4);
      }
      if (((int)(uVar7 + 1) < (int)uVar12) && (bVar4)) {
        local_78._M_head_impl = (int *)(long)(int)uVar12;
        lVar14 = (long)(int)uVar7 * 0xc;
        lVar8 = (long)(int)uVar7 + 2;
        do {
          uVar2 = local_88._8_8_;
          lVar5 = *(long *)(this + 0x50);
          iVar10 = iVar10 + *(int *)(lVar5 + 0x14 + lVar14);
          if (iVar10 < *(int *)(*(long *)(this + 0x58) +
                               (long)_Var3._M_t.
                                     super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                     .
                                     super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                     ._M_head_impl * 0xc)) {
            bVar4 = false;
          }
          else {
            bVar4 = iVar10 <= *(int *)(*(long *)(this + 0x58) +
                                       (long)_Var3._M_t.
                                             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                             .
                                             super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                             ._M_head_impl * 0xc + 4);
          }
          lVar9 = (long)*(int *)(lVar5 + 0x10 + lVar14);
          if (bVar4) {
            fVar1 = *(float *)(lVar5 + 0xc + lVar14);
            if ((fVar1 != 0.0) || (NAN(fVar1))) {
              bVar4 = fVar1 == 0.0;
              bVar15 = 0.0 < fVar1;
            }
            else {
              dVar17 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (*(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                    **)this);
              bVar4 = dVar17 == 0.5;
              bVar15 = 0.5 < dVar17;
            }
            bVar4 = !bVar15 && !bVar4;
          }
          if (bVar4) {
            bit_array_impl::set(&x->super_bit_array_impl,*(int *)(uVar2 + (lVar9 * 2 + 1) * 4));
            lVar5 = *(long *)(this + 0x68);
            auVar19 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc +
                                                               lVar14) * 0.5)),ZEXT416((uint)fVar16)
                                      ,ZEXT416((uint)delta));
            lVar9 = (long)*(int *)(uVar2 + lVar9 * 2 * 4);
            fVar1 = auVar19._0_4_ + *(float *)(lVar5 + lVar9 * 4);
          }
          else {
            bit_array_impl::unset(&x->super_bit_array_impl,*(int *)(uVar2 + (lVar9 * 2 + 1) * 4));
            lVar5 = *(long *)(this + 0x68);
            auVar19 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc +
                                                               lVar14) * 0.5)),ZEXT416((uint)fVar16)
                                      ,ZEXT416((uint)delta));
            lVar9 = (long)*(int *)(uVar2 + lVar9 * 2 * 4);
            fVar1 = *(float *)(lVar5 + lVar9 * 4) - auVar19._0_4_;
          }
          *(float *)(lVar5 + lVar9 * 4) = fVar1;
          bVar15 = lVar8 < (long)local_78._M_head_impl;
          uVar7 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar7;
          lVar14 = lVar14 + 0xc;
          lVar8 = lVar8 + 1;
        } while ((bool)(bVar15 & bVar4));
      }
      if ((int)(uVar7 + 1) < (int)uVar12) {
        lVar14 = (long)(int)uVar7 * 0xc;
        iVar10 = ~uVar7 + uVar12;
        do {
          uVar2 = local_88._8_8_;
          lVar8 = (long)*(int *)(*(long *)(this + 0x50) + 0x10 + lVar14);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_88._8_8_ + (lVar8 * 2 + 1) * 4));
          auVar19 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc + lVar14)
                                                  * 0.5)),ZEXT416((uint)fVar16),ZEXT416((uint)delta)
                                   );
          *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar2 + lVar8 * 2 * 4) * 4) =
               *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar2 + lVar8 * 2 * 4) * 4) -
               auVar19._0_4_;
          lVar14 = lVar14 + 0xc;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      bVar4 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>_>
                          *)this,(int)local_68._M_t.
                                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                      .
                                      super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                      ._M_head_impl,x);
      if (!bVar4) goto LAB_00145b9b;
      first._M_current =
           (pair<int,_int> *)
           ((long)local_40._M_t.
                  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                  _M_head_impl + 8);
    } while (first._M_current != (pair<int,_int> *)local_48._M_head_impl);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }